

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O1

int __thiscall
flow::RegExpGroupInstr::clone
          (RegExpGroupInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConstantInt *groupId;
  RegExpGroupInstr *this_00;
  
  groupId = (ConstantInt *)**(undefined8 **)(__fn + 0x50);
  this_00 = (RegExpGroupInstr *)operator_new(0x68);
  RegExpGroupInstr(this_00,groupId,(string *)(__fn + 0x10));
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)this_00;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> RegExpGroupInstr::clone() {
  return std::make_unique<RegExpGroupInstr>(groupId(), name());
}